

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void ns_close_conn(ns_connection *conn)

{
  ns_connection *conn_local;
  
  ns_call(conn,5,(void *)0x0);
  ns_remove_conn(conn);
  ns_destroy_conn(conn);
  return;
}

Assistant:

static void ns_close_conn(struct ns_connection *conn) {
  DBG(("%p %d", conn, conn->flags));
  ns_call(conn, NS_CLOSE, NULL);
  ns_remove_conn(conn);
  ns_destroy_conn(conn);
}